

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O2

QSharedPointer<QObject> __thiscall
QtSharedPointer::sharedPointerFromVariant_internal(QtSharedPointer *this,QVariant *variant)

{
  PrivateShared *pPVar1;
  Data *extraout_RDX;
  QSharedPointer<QObject> QVar2;
  
  if (((variant->d).field_0x18 & 1) != 0) {
    pPVar1 = (variant->d).data.shared;
    variant = (QVariant *)
              ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                      _q_value.super___atomic_base<int> + (long)pPVar1->offset);
  }
  QSharedPointer<QObject>::QSharedPointer
            ((QSharedPointer<QObject> *)this,(QSharedPointer<QObject> *)variant);
  QVar2.d = extraout_RDX;
  QVar2.value.ptr = (QObject *)this;
  return QVar2;
}

Assistant:

QSharedPointer<QObject> QtSharedPointer::sharedPointerFromVariant_internal(const QVariant &variant)
{
    Q_ASSERT(variant.metaType().flags() & QMetaType::SharedPointerToQObject);
    return *reinterpret_cast<const QSharedPointer<QObject>*>(variant.constData());
}